

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O0

lys_module *
ly_resolve_prefix(ly_ctx *ctx,void *prefix,size_t prefix_len,LY_VALUE_FORMAT format,
                 void *prefix_data)

{
  ly_ctx *local_40;
  lys_module *mod;
  void *prefix_data_local;
  LY_VALUE_FORMAT format_local;
  size_t prefix_len_local;
  void *prefix_local;
  ly_ctx *ctx_local;
  
  local_40 = (ly_ctx *)0x0;
  if (prefix == (void *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","prefix","ly_resolve_prefix");
    ctx_local = (ly_ctx *)0x0;
  }
  else if (prefix_len == 0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","prefix_len","ly_resolve_prefix");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    switch(format) {
    case LY_VALUE_CANON:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
      local_40 = (ly_ctx *)ly_json_resolve_prefix(ctx,(char *)prefix,prefix_len,prefix_data);
      break;
    case LY_VALUE_SCHEMA:
      local_40 = (ly_ctx *)ly_schema_resolve_prefix(ctx,(char *)prefix,prefix_len,prefix_data);
      break;
    case LY_VALUE_SCHEMA_RESOLVED:
      local_40 = (ly_ctx *)
                 ly_schema_resolved_resolve_prefix(ctx,(char *)prefix,prefix_len,prefix_data);
      break;
    case LY_VALUE_XML:
    case LY_VALUE_STR_NS:
      local_40 = (ly_ctx *)ly_xml_resolve_prefix(ctx,(char *)prefix,prefix_len,prefix_data);
    }
    ctx_local = local_40;
  }
  return (lys_module *)ctx_local;
}

Assistant:

const struct lys_module *
ly_resolve_prefix(const struct ly_ctx *ctx, const void *prefix, size_t prefix_len, LY_VALUE_FORMAT format,
        const void *prefix_data)
{
    const struct lys_module *mod = NULL;

    LY_CHECK_ARG_RET(ctx, prefix, prefix_len, NULL);

    switch (format) {
    case LY_VALUE_SCHEMA:
        mod = ly_schema_resolve_prefix(ctx, prefix, prefix_len, prefix_data);
        break;
    case LY_VALUE_SCHEMA_RESOLVED:
        mod = ly_schema_resolved_resolve_prefix(ctx, prefix, prefix_len, prefix_data);
        break;
    case LY_VALUE_XML:
    case LY_VALUE_STR_NS:
        mod = ly_xml_resolve_prefix(ctx, prefix, prefix_len, prefix_data);
        break;
    case LY_VALUE_CANON:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        mod = ly_json_resolve_prefix(ctx, prefix, prefix_len, prefix_data);
        break;
    }

    return mod;
}